

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_assertion.hpp
# Opt level: O3

AssertionResult *
iuutil::CmpHelperIsNan<long_double>
          (AssertionResult *__return_storage_ptr__,char *actual_str,longdouble *actual)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  AssertionResult *pAVar3;
  char *local_48;
  AssertionResult local_40;
  
  if (((uint)(float)*actual & 0x7fffff) == 0 || (~(uint)(float)*actual & 0x7f800000) != 0) {
    paVar1 = &local_40.m_message.field_2;
    local_40.m_message._M_string_length = 0;
    local_40.m_message.field_2._M_local_buf[0] = '\0';
    local_40.m_result = false;
    local_48 = actual_str;
    local_40.m_message._M_dataplus._M_p = (pointer)paVar1;
    pAVar3 = iutest::AssertionResult::operator<<(&local_40,(char (*) [18])"error: Value of: ");
    pAVar3 = iutest::AssertionResult::operator<<(pAVar3,&local_48);
    pAVar3 = iutest::AssertionResult::operator<<(pAVar3,(char (*) [12])"\n  Actual: ");
    pAVar3 = iutest::AssertionResult::operator<<(pAVar3,actual);
    pAVar3 = iutest::AssertionResult::operator<<(pAVar3,(char (*) [15])"\nExpected: NaN");
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    pcVar2 = (pAVar3->m_message)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pAVar3->m_message)._M_string_length
              );
    __return_storage_ptr__->m_result = pAVar3->m_result;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_40.m_message._M_dataplus._M_p,
                      CONCAT71(local_40.m_message.field_2._M_allocated_capacity._1_7_,
                               local_40.m_message.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  return __return_storage_ptr__;
}

Assistant:

inline ::iutest::AssertionResult IUTEST_ATTRIBUTE_UNUSED_ CmpHelperIsNan(const char* actual_str, const T& actual)
{
    if( floationg_point_helper::CastToFloatingPoint(actual).is_nan() )
    {
        return ::iutest::AssertionSuccess();
    }
    return ::iutest::AssertionFailure() << "error: Value of: " << actual_str
        << "\n  Actual: " << actual << "\nExpected: NaN";
}